

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_read_mct(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                     opj_event_mgr *p_manager)

{
  uint uVar1;
  opj_mct_data_t *__ptr;
  OPJ_BYTE *pOVar2;
  char *fmt;
  opj_tcp_v2_t *poVar3;
  uint uVar4;
  opj_mct_data_t *poVar5;
  uint uVar6;
  ulong uVar7;
  OPJ_UINT32 l_tmp;
  uint local_3c;
  OPJ_BYTE *local_38;
  
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar3 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar3 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size < 2) goto LAB_001232a9;
  opj_read_bytes_LE(p_header_data,&local_3c,2);
  if (local_3c != 0) {
    fmt = "Cannot take in charge mct data within multiple MCT records\n";
    goto LAB_001232e6;
  }
  if (p_header_size < 7) goto LAB_001232a9;
  local_38 = p_header_data;
  opj_read_bytes_LE(p_header_data + 2,&local_3c,2);
  __ptr = poVar3->m_mct_records;
  uVar6 = poVar3->m_nb_mct_records;
  uVar7 = (ulong)uVar6;
  uVar1 = 0;
  uVar4 = local_3c & 0xff;
  poVar5 = __ptr;
  if (uVar7 == 0) {
LAB_0012335c:
    if (uVar1 == uVar6) goto LAB_00123361;
  }
  else {
    do {
      if (poVar5->m_index == uVar4) goto LAB_0012335c;
      poVar5 = poVar5 + 1;
      uVar1 = uVar1 + 1;
    } while (uVar6 != uVar1);
LAB_00123361:
    if (uVar6 == poVar3->m_nb_max_mct_records) {
      poVar3->m_nb_max_mct_records = uVar6 + 10;
      __ptr = (opj_mct_data_t *)realloc(__ptr,(ulong)(uVar6 + 10) << 5);
      poVar3->m_mct_records = __ptr;
      if (__ptr == (opj_mct_data_t *)0x0) goto LAB_001232a9;
      uVar7 = (ulong)poVar3->m_nb_mct_records;
      memset(__ptr + uVar7,0,(ulong)(poVar3->m_nb_max_mct_records - poVar3->m_nb_mct_records) << 5);
    }
    poVar5 = __ptr + uVar7;
  }
  pOVar2 = local_38 + 4;
  if (poVar5->m_data != (OPJ_BYTE *)0x0) {
    free(poVar5->m_data);
    poVar5->m_data = (OPJ_BYTE *)0x0;
  }
  poVar5->m_index = uVar4;
  poVar5->m_array_type = local_3c >> 8 & (MCT_TYPE_OFFSET|MCT_TYPE_DECORRELATION);
  poVar5->m_element_type = local_3c >> 10 & MCT_TYPE_DOUBLE;
  opj_read_bytes_LE(pOVar2,&local_3c,2);
  if (local_3c != 0) {
    fmt = "Cannot take in charge multiple MCT markers\n";
LAB_001232e6:
    opj_event_msg_v2(p_manager,2,fmt);
    return 1;
  }
  uVar6 = p_header_size - 6;
  pOVar2 = (OPJ_BYTE *)malloc((ulong)uVar6);
  poVar5->m_data = pOVar2;
  if (pOVar2 != (OPJ_BYTE *)0x0) {
    memcpy(pOVar2,local_38 + 6,(ulong)uVar6);
    poVar5->m_data_size = uVar6;
    poVar3->m_nb_mct_records = poVar3->m_nb_mct_records + 1;
    return 1;
  }
LAB_001232a9:
  opj_event_msg_v2(p_manager,1,"Error reading MCT marker\n");
  return 0;
}

Assistant:

opj_bool j2k_read_mct (	opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager )
{
	OPJ_UINT32 i;
	opj_tcp_v2_t *l_tcp = 00;
	OPJ_UINT32 l_tmp;
	OPJ_UINT32 l_indix;
	opj_mct_data_t * l_mct_data;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);

	l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
			&p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
			p_j2k->m_specific_param.m_decoder.m_default_tcp;

	if (p_header_size < 2) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}

	/* first marker */
	opj_read_bytes(p_header_data,&l_tmp,2);				/* Zmct */
	p_header_data += 2;
	if (l_tmp != 0) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge mct data within multiple MCT records\n");
		return OPJ_TRUE;
	}

	if(p_header_size <= 6) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}

	/* Imct -> no need for other values, take the first, type is double with decorrelation x0000 1101 0000 0000*/
	opj_read_bytes(p_header_data,&l_tmp,2); 			/* Imct */
	p_header_data += 2;

	l_indix = l_tmp & 0xff;
	l_mct_data = l_tcp->m_mct_records;

	for (i=0;i<l_tcp->m_nb_mct_records;++i) {
		if (l_mct_data->m_index == l_indix) {
			break;
		}
		++l_mct_data;
	}

	/* NOT FOUND */
	if (i == l_tcp->m_nb_mct_records) {
		if (l_tcp->m_nb_mct_records == l_tcp->m_nb_max_mct_records) {
			l_tcp->m_nb_max_mct_records += J2K_MCT_DEFAULT_NB_RECORDS;

			l_tcp->m_mct_records = (opj_mct_data_t*)opj_realloc(l_tcp->m_mct_records,l_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
			if(! l_tcp->m_mct_records) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
				return OPJ_FALSE;
			}

			l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
			memset(l_mct_data ,0,(l_tcp->m_nb_max_mct_records - l_tcp->m_nb_mct_records) * sizeof(opj_mct_data_t));
		}

		l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
	}

	if (l_mct_data->m_data) {
		opj_free(l_mct_data->m_data);
		l_mct_data->m_data = 00;
	}

	l_mct_data->m_index = l_indix;
	l_mct_data->m_array_type = (J2K_MCT_ARRAY_TYPE)((l_tmp  >> 8) & 3);
	l_mct_data->m_element_type = (J2K_MCT_ELEMENT_TYPE)((l_tmp  >> 10) & 3);

	opj_read_bytes(p_header_data,&l_tmp,2);				/* Ymct */
	p_header_data+=2;
	if (l_tmp != 0) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge multiple MCT markers\n");
		return OPJ_TRUE;
	}

	p_header_size -= 6;

	l_mct_data->m_data = (OPJ_BYTE*)opj_malloc(p_header_size);
	if (! l_mct_data->m_data) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}
	memcpy(l_mct_data->m_data,p_header_data,p_header_size);

	l_mct_data->m_data_size = p_header_size;
	++l_tcp->m_nb_mct_records;

	return OPJ_TRUE;
}